

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_if_suite.cpp
# Opt level: O0

void find_map(void)

{
  bool v;
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_358;
  undefined4 local_350 [2];
  iterator local_348;
  iterator local_330;
  iterator local_318;
  iterator local_300;
  difference_type local_2e8 [2];
  undefined4 local_2d8 [2];
  iterator local_2d0;
  iterator local_2b8;
  iterator local_2a0;
  iterator local_288;
  difference_type local_270 [2];
  undefined4 local_260 [2];
  iterator local_258;
  iterator local_240;
  iterator local_228;
  iterator local_210;
  difference_type local_1f8 [2];
  iterator local_1e8;
  iterator local_1c8;
  iterator local_1b0;
  iterator local_198;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_170;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  local_170 = &local_168;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (local_170,(char (*) [6])"alpha",(char (*) [9])"hydrogen");
  local_170 = &local_108;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[7],_true>
            (local_170,(char (*) [6])"bravo",(char (*) [7])"helium");
  local_170 = &local_a8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[8],_true>
            (local_170,(char (*) [8])"charlie",(char (*) [8])"lithium");
  local_48._0_8_ = &local_168;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_358 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_358 = local_358 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_358);
  } while (local_358 != &local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,find_map()::__0>
            (&local_198,&local_1b0,&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  v = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                (&local_198,&local_1e8);
  boost::detail::test_impl
            ("std::find_if(data.begin(), data.end(), [] (const variable& value) { return value == \"alpha\"; }) == data.end()"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_if_suite.cpp"
             ,0xa5,"void find_map()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_210,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_240,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_258,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,find_map()::__1>
            (&local_228,&local_240,&local_258);
  local_1f8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_210,&local_228);
  local_260[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find_if(data.begin(), data.end(), [] (const variable& value) { return value == \"hydrogen\"; }))"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_if_suite.cpp"
             ,0xa9,"void find_map()",local_1f8,local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_288,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,find_map()::__2>
            (&local_2a0,&local_2b8,&local_2d0);
  local_270[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_288,&local_2a0);
  local_2d8[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find_if(data.begin(), data.end(), [] (const variable& value) { return value == \"helium\"; }))"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_if_suite.cpp"
             ,0xad,"void find_map()",local_270,local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_330,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_348,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,find_map()::__3>
            (&local_318,&local_330,&local_348);
  local_2e8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_300,&local_318);
  local_350[0] = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), std::find_if(data.begin(), data.end(), [] (const variable& value) { return value == \"lithium\"; }))"
             ,"2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_if_suite.cpp"
             ,0xb1,"void find_map()",local_2e8,local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_330);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void find_map()
{
    variable data = map::make(
        {
            {"alpha", "hydrogen"},
            {"bravo", "helium"},
            {"charlie", "lithium"}
        });
    // Iterator dereferences value, not key
    TRIAL_PROTOCOL_TEST(std::find_if(data.begin(), data.end(),
                                     [] (const variable& value) { return value == "alpha"; }) == data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find_if(data.begin(), data.end(),
                                                         [] (const variable& value) { return value == "hydrogen"; })),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find_if(data.begin(), data.end(),
                                                         [] (const variable& value) { return value == "helium"; })),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(),
                                            std::find_if(data.begin(), data.end(),
                                                         [] (const variable& value) { return value == "lithium"; })),
                              2);
}